

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDD.cpp
# Opt level: O2

void __thiscall chrono::fea::ChNodeFEAxyzDD::SetNoSpeedNoAcceleration(ChNodeFEAxyzDD *this)

{
  double dVar1;
  
  ChNodeFEAxyzD::SetNoSpeedNoAcceleration(&this->super_ChNodeFEAxyzD);
  dVar1 = DAT_011dd3e0;
  if (this != (ChNodeFEAxyzDD *)(QNULL + 0x10)) {
    (this->DD_dt).m_data[0] = VNULL;
    (this->DD_dt).m_data[1] = dVar1;
    (this->DD_dt).m_data[2] = DAT_011dd3e8;
  }
  dVar1 = DAT_011dd3e0;
  if (this != (ChNodeFEAxyzDD *)&std::__ioinit) {
    (this->DD_dtdt).m_data[0] = VNULL;
    (this->DD_dtdt).m_data[1] = dVar1;
    (this->DD_dtdt).m_data[2] = DAT_011dd3e8;
  }
  return;
}

Assistant:

void ChNodeFEAxyzDD::SetNoSpeedNoAcceleration() {
    ChNodeFEAxyzD::SetNoSpeedNoAcceleration();

    DD_dt = VNULL;
    DD_dtdt = VNULL;
}